

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clip_x86_avx.cpp
# Opt level: O3

int __thiscall
ncnn::Clip_x86_avx::forward_inplace(Clip_x86_avx *this,Mat *bottom_top_blob,Option *opt)

{
  undefined4 uVar1;
  float fVar2;
  uint uVar3;
  _func_int **pp_Var4;
  size_t sVar5;
  size_t sVar6;
  void *pvVar7;
  undefined1 auVar8 [16];
  undefined1 auVar9 [32];
  int iVar10;
  ulong uVar11;
  ulong uVar12;
  undefined1 (*pauVar13) [16];
  undefined1 (*pauVar14) [32];
  int iVar15;
  float *pfVar16;
  _func_int *p_Var17;
  float fVar18;
  undefined1 auVar19 [16];
  undefined1 auVar20 [32];
  undefined1 auVar21 [16];
  undefined1 auVar22 [32];
  
  uVar3 = bottom_top_blob->c;
  uVar11 = (ulong)uVar3;
  iVar10 = bottom_top_blob->h * bottom_top_blob->w;
  if (bottom_top_blob->elempack == 8) {
    if (0 < (int)uVar3) {
      pp_Var4 = this->_vptr_Clip_x86_avx;
      uVar12 = 0;
      do {
        if (0 < iVar10) {
          uVar1 = *(undefined4 *)(&this->field_0xd4 + (long)pp_Var4[-3]);
          auVar20._4_4_ = uVar1;
          auVar20._0_4_ = uVar1;
          auVar20._8_4_ = uVar1;
          auVar20._12_4_ = uVar1;
          auVar20._16_4_ = uVar1;
          auVar20._20_4_ = uVar1;
          auVar20._24_4_ = uVar1;
          auVar20._28_4_ = uVar1;
          uVar1 = *(undefined4 *)(&this->field_0xd0 + (long)pp_Var4[-3]);
          auVar22._4_4_ = uVar1;
          auVar22._0_4_ = uVar1;
          auVar22._8_4_ = uVar1;
          auVar22._12_4_ = uVar1;
          auVar22._16_4_ = uVar1;
          auVar22._20_4_ = uVar1;
          auVar22._24_4_ = uVar1;
          auVar22._28_4_ = uVar1;
          pauVar14 = (undefined1 (*) [32])
                     (bottom_top_blob->cstep * uVar12 * bottom_top_blob->elemsize +
                     (long)bottom_top_blob->data);
          iVar15 = iVar10;
          do {
            auVar9 = vmaxps_avx(auVar22,*pauVar14);
            auVar9 = vminps_avx(auVar9,auVar20);
            *pauVar14 = auVar9;
            pauVar14 = pauVar14 + 1;
            iVar15 = iVar15 + -1;
          } while (iVar15 != 0);
        }
        uVar12 = uVar12 + 1;
      } while (uVar12 != uVar11);
    }
  }
  else if (bottom_top_blob->elempack == 4) {
    if (0 < (int)uVar3) {
      pp_Var4 = this->_vptr_Clip_x86_avx;
      uVar12 = 0;
      do {
        if (0 < iVar10) {
          uVar1 = *(undefined4 *)(&this->field_0xd4 + (long)pp_Var4[-3]);
          auVar19._4_4_ = uVar1;
          auVar19._0_4_ = uVar1;
          auVar19._8_4_ = uVar1;
          auVar19._12_4_ = uVar1;
          uVar1 = *(undefined4 *)(&this->field_0xd0 + (long)pp_Var4[-3]);
          auVar21._4_4_ = uVar1;
          auVar21._0_4_ = uVar1;
          auVar21._8_4_ = uVar1;
          auVar21._12_4_ = uVar1;
          pauVar13 = (undefined1 (*) [16])
                     (bottom_top_blob->cstep * uVar12 * bottom_top_blob->elemsize +
                     (long)bottom_top_blob->data);
          iVar15 = iVar10;
          do {
            auVar8 = vmaxps_avx(auVar21,*pauVar13);
            auVar8 = vminps_avx(auVar8,auVar19);
            *pauVar13 = auVar8;
            pauVar13 = pauVar13 + 1;
            iVar15 = iVar15 + -1;
          } while (iVar15 != 0);
        }
        uVar12 = uVar12 + 1;
      } while (uVar12 != uVar11);
    }
  }
  else if (0 < (int)uVar3) {
    sVar5 = bottom_top_blob->cstep;
    sVar6 = bottom_top_blob->elemsize;
    pvVar7 = bottom_top_blob->data;
    pp_Var4 = this->_vptr_Clip_x86_avx;
    uVar12 = 0;
    do {
      if (0 < iVar10) {
        pfVar16 = (float *)(sVar5 * sVar6 * uVar12 + (long)pvVar7);
        iVar15 = iVar10 + 1;
        do {
          p_Var17 = pp_Var4[-3];
          fVar2 = *(float *)(&this->field_0xd0 + (long)p_Var17);
          fVar18 = *pfVar16;
          if (*pfVar16 < fVar2) {
            *pfVar16 = fVar2;
            p_Var17 = pp_Var4[-3];
            fVar18 = fVar2;
          }
          if (*(float *)(&this->field_0xd4 + (long)p_Var17) < fVar18) {
            *pfVar16 = *(float *)(&this->field_0xd4 + (long)p_Var17);
          }
          pfVar16 = pfVar16 + 1;
          iVar15 = iVar15 + -1;
        } while (1 < iVar15);
      }
      uVar12 = uVar12 + 1;
    } while (uVar12 != uVar11);
  }
  return 0;
}

Assistant:

int Clip_x86_avx::forward_inplace(Mat& bottom_top_blob, const Option& opt) const
{
    int w = bottom_top_blob.w;
    int h = bottom_top_blob.h;
    int channels = bottom_top_blob.c;
    int size = w * h;
#if __SSE2__
    int elempack = bottom_top_blob.elempack;

#if __AVX__
    if (elempack == 8)
    {
        #pragma omp parallel for num_threads(opt.num_threads)
        for (int q = 0; q < channels; q++)
        {
            float* ptr = bottom_top_blob.channel(q);

            __m256 _max = _mm256_set1_ps(max);
            __m256 _min = _mm256_set1_ps(min);

            for (int i = 0; i < size; i++)
            {
                __m256 _ptr = _mm256_loadu_ps(ptr);
                _ptr = _mm256_max_ps(_ptr, _min);
                _ptr = _mm256_min_ps(_ptr, _max);
                _mm256_storeu_ps(ptr, _ptr);

                ptr += 8;
            }
        }

        return 0;
    }
#endif // __AVX__

    if (elempack == 4)
    {
        #pragma omp parallel for num_threads(opt.num_threads)
        for (int q = 0; q < channels; q++)
        {
            float* ptr = bottom_top_blob.channel(q);

            __m128 _max = _mm_set1_ps(max);
            __m128 _min = _mm_set1_ps(min);

            for (int i = 0; i < size; i++)
            {
                __m128 _ptr = _mm_loadu_ps(ptr);
                _ptr = _mm_max_ps(_ptr, _min);
                _ptr = _mm_min_ps(_ptr, _max);
                _mm_storeu_ps(ptr, _ptr);

                ptr += 4;
            }
        }

        return 0;
    }
#endif // __SSE2__

    #pragma omp parallel for num_threads(opt.num_threads)
    for (int q = 0; q < channels; q++)
    {
        float* ptr = bottom_top_blob.channel(q);

        int remain = size;
        for (; remain > 0; remain--)
        {
            if (*ptr < min)
                *ptr = min;

            if (*ptr > max)
                *ptr = max;

            ptr++;
        }
    }

    return 0;
}